

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::executePendingSort(QTreeWidgetItem *this)

{
  QTreeModel *this_00;
  
  this_00 = treeModel(this,(QTreeWidget *)0x0);
  if (this_00 != (QTreeModel *)0x0) {
    QTreeModel::executePendingSort(this_00);
    return;
  }
  return;
}

Assistant:

void QTreeWidgetItem::executePendingSort() const
{
    if (QTreeModel *model = treeModel())
        model->executePendingSort();
}